

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_kv_cursor_init(unqlite *pDb,unqlite_kv_cursor **ppOut)

{
  uint uVar1;
  unqlite_kv_methods *puVar2;
  sxu32 nByte;
  int iVar3;
  unqlite_kv_cursor *pSrc;
  
  if (((pDb != (unqlite *)0x0) && (ppOut != (unqlite_kv_cursor **)0x0)) &&
     (pDb->nMagic == 0xdb7c2712)) {
    puVar2 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods;
    uVar1 = puVar2->szCursor;
    if ((int)uVar1 < 1) {
      unqliteGenErrorFormat(pDb,"Storage engine \'%s\' does not support cursors",puVar2->zName);
      iVar3 = -0x11;
    }
    else {
      nByte = uVar1 | 8;
      if (7 < uVar1) {
        nByte = uVar1;
      }
      pSrc = (unqlite_kv_cursor *)SyMemBackendPoolAlloc(&pDb->sMem,nByte);
      if (pSrc == (unqlite_kv_cursor *)0x0) {
        unqliteGenOutofMem(pDb);
        iVar3 = -1;
      }
      else {
        SyZero(pSrc,nByte);
        pSrc->pStore = ((pDb->sDB).pPager)->pEngine;
        if (puVar2->xCursorInit != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
          (*puVar2->xCursorInit)(pSrc);
        }
        *ppOut = pSrc;
        iVar3 = 0;
      }
    }
    return iVar3;
  }
  return -0x18;
}

Assistant:

int unqlite_kv_cursor_init(unqlite *pDb,unqlite_kv_cursor **ppOut)
{
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) || ppOut == 0 /* Noop */){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Allocate a new cursor */
	 rc = unqliteInitCursor(pDb,ppOut);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	 return rc;
}